

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::ItemAdd(ImRect *bb,ImGuiID *id)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *pIVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  bool bVar6;
  ImGuiID IVar7;
  
  pIVar4 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->Accessed = true;
  if (id == (ImGuiID *)0x0) {
    IVar7 = 0;
  }
  else {
    IVar7 = *id;
  }
  (pIVar1->DC).LastItemId = IVar7;
  IVar3 = bb->Max;
  (pIVar1->DC).LastItemRect.Min = bb->Min;
  (pIVar1->DC).LastItemRect.Max = IVar3;
  (pIVar1->DC).LastItemHoveredAndUsable = false;
  (pIVar1->DC).LastItemHoveredRect = false;
  bVar5 = IsClippedEx(bb,id,false);
  if ((!bVar5) && (bVar6 = IsMouseHoveringRect(&bb->Min,&bb->Max,true), bVar6)) {
    (pIVar1->DC).LastItemHoveredRect = true;
    if (((pIVar4->HoveredRootWindow == pIVar1->RootWindow) &&
        ((IVar7 = pIVar4->ActiveId, IVar7 == 0 ||
         ((((id != (ImGuiID *)0x0 && (IVar7 == *id)) || (pIVar4->ActiveIdAllowOverlap != false)) ||
          (IVar7 == pIVar1->MoveId)))))) &&
       ((((pIVar4->FocusedWindow == (ImGuiWindow *)0x0 ||
          (pIVar2 = pIVar4->FocusedWindow->RootWindow, pIVar2 == (ImGuiWindow *)0x0)) ||
         ((pIVar2->Flags & 0x2000000) == 0)) ||
        ((pIVar2 == pIVar4->HoveredRootWindow || (pIVar2->WasActive == false)))))) {
      (pIVar1->DC).LastItemHoveredAndUsable = true;
    }
  }
  return !bVar5;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, const ImGuiID* id)
{
    ImGuiWindow* window = GetCurrentWindow();
    window->DC.LastItemId = id ? *id : 0;
    window->DC.LastItemRect = bb;
    window->DC.LastItemHoveredAndUsable = window->DC.LastItemHoveredRect = false;
    if (IsClippedEx(bb, id, false))
        return false;

    // This is a sensible default, but widgets are free to override it after calling ItemAdd()
    ImGuiContext& g = *GImGui;
    if (IsMouseHoveringRect(bb.Min, bb.Max))
    {
        // Matching the behavior of IsHovered() but allow if ActiveId==window->MoveID (we clicked on the window background)
        // So that clicking on items with no active id such as Text() still returns true with IsItemHovered()
        window->DC.LastItemHoveredRect = true;
        if (g.HoveredRootWindow == window->RootWindow)
            if (g.ActiveId == 0 || (id && g.ActiveId == *id) || g.ActiveIdAllowOverlap || (g.ActiveId == window->MoveId))
                if (IsWindowContentHoverable(window))
                    window->DC.LastItemHoveredAndUsable = true;
    }

    return true;
}